

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compress2(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  size_t *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  ZSTD_CCtx *in_RDI;
  void *in_R8;
  size_t *unaff_retaddr;
  ZSTD_EndDirective in_stack_00000008;
  size_t err_code;
  size_t result;
  size_t iPos;
  size_t oPos;
  ZSTD_bufferMode_e originalOutBufferMode;
  ZSTD_bufferMode_e originalInBufferMode;
  ZSTD_CCtx *in_stack_ffffffffffffff98;
  ZSTD_bufferMode_e ZVar2;
  ZSTD_bufferMode_e ZVar3;
  size_t local_8;
  
  ZVar3 = (in_RDI->requestedParams).inBufferMode;
  ZVar2 = (in_RDI->requestedParams).outBufferMode;
  ZSTD_CCtx_reset(in_stack_ffffffffffffff98,0);
  (in_RDI->requestedParams).inBufferMode = ZSTD_bm_stable;
  (in_RDI->requestedParams).outBufferMode = ZSTD_bm_stable;
  local_8 = ZSTD_compressStream2_simpleArgs
                      (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,CONCAT44(ZVar3,ZVar2),unaff_retaddr,
                       in_stack_00000008);
  (in_RDI->requestedParams).inBufferMode = ZVar3;
  (in_RDI->requestedParams).outBufferMode = ZVar2;
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    if (local_8 == 0) {
      if (in_R8 != (void *)0x0) {
        __assert_fail("iPos == srcSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6985,
                      "size_t ZSTD_compress2(ZSTD_CCtx *, void *, size_t, const void *, size_t)");
      }
      local_8 = 0;
    }
    else {
      if (in_RDX != 0) {
        __assert_fail("oPos == dstCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6982,
                      "size_t ZSTD_compress2(ZSTD_CCtx *, void *, size_t, const void *, size_t)");
      }
      local_8 = 0xffffffffffffffba;
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_compress2(ZSTD_CCtx* cctx,
                      void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize)
{
    ZSTD_bufferMode_e const originalInBufferMode = cctx->requestedParams.inBufferMode;
    ZSTD_bufferMode_e const originalOutBufferMode = cctx->requestedParams.outBufferMode;
    DEBUGLOG(4, "ZSTD_compress2 (srcSize=%u)", (unsigned)srcSize);
    ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
    /* Enable stable input/output buffers. */
    cctx->requestedParams.inBufferMode = ZSTD_bm_stable;
    cctx->requestedParams.outBufferMode = ZSTD_bm_stable;
    {   size_t oPos = 0;
        size_t iPos = 0;
        size_t const result = ZSTD_compressStream2_simpleArgs(cctx,
                                        dst, dstCapacity, &oPos,
                                        src, srcSize, &iPos,
                                        ZSTD_e_end);
        /* Reset to the original values. */
        cctx->requestedParams.inBufferMode = originalInBufferMode;
        cctx->requestedParams.outBufferMode = originalOutBufferMode;

        FORWARD_IF_ERROR(result, "ZSTD_compressStream2_simpleArgs failed");
        if (result != 0) {  /* compression not completed, due to lack of output space */
            assert(oPos == dstCapacity);
            RETURN_ERROR(dstSize_tooSmall, "");
        }
        assert(iPos == srcSize);   /* all input is expected consumed */
        return oPos;
    }
}